

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O2

string * __thiscall llvm::Twine::str_abi_cxx11_(string *__return_storage_ptr__,Twine *this)

{
  NodeKind NVar1;
  undefined1 local_130 [8];
  SmallString<256U> Vec;
  
  NVar1 = this->RHSKind ^ EmptyKind;
  if (this->LHSKind == StdStringKind && NVar1 == NullKind) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->LHS).twine);
  }
  else if (this->LHSKind == FormatvObjectKind && NVar1 == NullKind) {
    formatv_object_base::str_abi_cxx11_(__return_storage_ptr__,(this->LHS).formatvObject);
  }
  else {
    local_130 = (undefined1  [8])
                &Vec.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Vec.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x10000000000;
    join_0x00000010_0x00000000_ = toStringRef(this,(SmallVectorImpl<char> *)local_130);
    StringRef::str_abi_cxx11_
              (__return_storage_ptr__,
               (StringRef *)
               (Vec.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts +
               0xf8));
    SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Twine::str() const {
  // If we're storing only a std::string, just return it.
  if (LHSKind == StdStringKind && RHSKind == EmptyKind)
    return *LHS.stdString;

  // If we're storing a formatv_object, we can avoid an extra copy by formatting
  // it immediately and returning the result.
  if (LHSKind == FormatvObjectKind && RHSKind == EmptyKind)
    return LHS.formatvObject->str();

  // Otherwise, flatten and copy the contents first.
  SmallString<256> Vec;
  return toStringRef(Vec).str();
}